

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjgc.cpp
# Opt level: O0

void GC::Mark(DObject **obj)

{
  DObject *this;
  bool bVar1;
  DObject *lobj;
  DObject **obj_local;
  
  this = *obj;
  if (this != (DObject *)0x0) {
    if ((this->ObjectFlags & 0x20) == 0) {
      bVar1 = DObject::IsWhite(this);
      if (bVar1) {
        DObject::White2Gray(this);
        this->GCNext = Gray;
        Gray = this;
      }
    }
    else {
      *obj = (DObject *)0x0;
    }
  }
  return;
}

Assistant:

void Mark(DObject **obj)
{
	DObject *lobj = *obj;
	if (lobj != NULL)
	{
		if (lobj->ObjectFlags & OF_EuthanizeMe)
		{
			*obj = (DObject *)NULL;
		}
		else if (lobj->IsWhite())
		{
			lobj->White2Gray();
			lobj->GCNext = Gray;
			Gray = lobj;
		}
	}
}